

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::FunctionValidator::visitArrayNew<wasm::ArrayNewData>
          (FunctionValidator *this,ArrayNewData *curr)

{
  ulong uVar1;
  bool bVar2;
  HeapTypeKind HVar3;
  HeapType local_20;
  HeapType heapType;
  
  ValidationInfo::shouldBeTrue<wasm::ArrayNewData*>
            (this->info,
             (bool)((byte)((((this->
                             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                             ).
                             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .
                             super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                            .currModule)->features).features >> 10) & 1),curr,
             "array.new_{data, elem} requires gc [--enable-gc]",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewData*,wasm::Type>
            (this->info,(Type)(curr->offset->type).id,(Type)0x2,curr,
             "array.new_{data, elem} offset must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::ArrayNewData*,wasm::Type>
            (this->info,(Type)(curr->size->type).id,(Type)0x2,curr,
             "array.new_{data, elem} size must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.type.id;
  if (uVar1 != 1) {
    bVar2 = ValidationInfo::shouldBeTrue<wasm::ArrayNewData*>
                      (this->info,(uVar1 & 1) == 0 && 6 < uVar1,curr,
                       "array.new_{data, elem} type should be an array reference",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar2) {
      local_20 = wasm::Type::getHeapType
                           (&(curr->super_SpecificExpression<(wasm::Expression::Id)71>).
                             super_Expression.type);
      HVar3 = HeapType::getKind(&local_20);
      ValidationInfo::shouldBeTrue<wasm::ArrayNewData*>
                (this->info,HVar3 == Array,curr,
                 "array.new_{data, elem} type should be an array reference",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
    }
  }
  return;
}

Assistant:

void FunctionValidator::visitArrayNew(ArrayNew* curr) {
  shouldBeTrue(getModule()->features.hasGC(),
               curr,
               "array.new_{data, elem} requires gc [--enable-gc]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->offset->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} offset must be an i32");
  shouldBeEqualOrFirstIsUnreachable(
    curr->size->type,
    Type(Type::i32),
    curr,
    "array.new_{data, elem} size must be an i32");
  if (curr->type == Type::unreachable) {
    return;
  }
  if (!shouldBeTrue(
        curr->type.isRef(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
  auto heapType = curr->type.getHeapType();
  if (!shouldBeTrue(
        heapType.isArray(),
        curr,
        "array.new_{data, elem} type should be an array reference")) {
    return;
  }
}